

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractfileengine.cpp
# Opt level: O0

void __thiscall
QAbstractFileEngineHandler::QAbstractFileEngineHandler(QAbstractFileEngineHandler *this)

{
  long lVar1;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  QWriteLocker locker;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  QWriteLocker *in_stack_ffffffffffffffc0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *in_RDI = &PTR__QAbstractFileEngineHandler_00be24e8;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fileEngineHandlerMutex>_>::
  operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fileEngineHandlerMutex>_>
              *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  QWriteLocker::QWriteLocker
            (in_stack_ffffffffffffffc0,
             (QReadWriteLock *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  QBasicAtomicInteger<int>::storeRelaxed
            ((QBasicAtomicInteger<int> *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fileEngineHandlers>_>::
  operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fileEngineHandlers>_>
              *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  QList<QAbstractFileEngineHandler_*>::prepend
            ((QList<QAbstractFileEngineHandler_*> *)0x26d30e,
             (parameter_type)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  QWriteLocker::~QWriteLocker((QWriteLocker *)0x26d31a);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QAbstractFileEngineHandler::QAbstractFileEngineHandler()
{
    QWriteLocker locker(fileEngineHandlerMutex());
    qt_file_engine_handlers_in_use.storeRelaxed(true);
    fileEngineHandlers()->prepend(this);
}